

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

uint bitmanip::getPriority(string *prefix)

{
  string_view msg;
  SourceLocation loc;
  iterator iVar1;
  long *plVar2;
  size_type *psVar3;
  size_t in_stack_ffffffffffffff50;
  _Alloc_hider local_90;
  size_type local_88;
  undefined8 uVar4;
  undefined8 in_stack_ffffffffffffff88;
  _Alloc_hider in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)testPriorityMap_abi_cxx11_,prefix);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(uint *)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                           ._M_cur + 0x28);
  }
  std::operator+(&local_30,"Priority for category ",prefix);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  local_90._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_90._M_p == psVar3) {
    uVar4 = *psVar3;
    in_stack_ffffffffffffff88 = plVar2[3];
    local_90._M_p = &stack0xffffffffffffff80;
  }
  else {
    uVar4 = *psVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_50,'\"',
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff90,&local_50,'\"');
  msg._M_str = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test.cpp";
  msg._M_len = in_stack_ffffffffffffff50;
  loc.function = (char *)in_stack_ffffffffffffff88;
  loc.file = (char *)uVar4;
  loc.line = (unsigned_long)in_stack_ffffffffffffff90._M_p;
  assertFail(msg,loc);
}

Assistant:

unsigned getPriority(const std::string &prefix)
{
    auto location = testPriorityMap.find(prefix);
    BITMANIP_ASSERT_MSG(location != testPriorityMap.end(), "Priority for category " + prefix + " is unspecified");
    return location->second;
}